

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkRenderPassCreationControlEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkRenderPassCreationControlEXT>
          (Impl *this,VkRenderPassCreationControlEXT *src,size_t count,ScratchAllocator *alloc)

{
  VkRenderPassCreationControlEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkRenderPassCreationControlEXT>(alloc,count);
    if (pVVar1 != (VkRenderPassCreationControlEXT *)0x0) {
      pVVar1 = (VkRenderPassCreationControlEXT *)memmove(pVVar1,src,count * 0x18);
      return pVVar1;
    }
  }
  return (VkRenderPassCreationControlEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}